

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2sparse.c
# Opt level: O3

int mod2sparse_equal(mod2sparse *m1,mod2sparse *m2)

{
  byte *pbVar1;
  uint uVar2;
  int col;
  bool bVar3;
  int iVar4;
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar5;
  void *extraout_RAX;
  void *pvVar6;
  mod2entry *pmVar7;
  mod2sparse *r;
  mod2sparse *r_00;
  void *__s;
  mod2entry *pmVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  
  uVar2 = m1->n_rows;
  if ((uVar2 == m2->n_rows) && (m1->n_cols == m2->n_cols)) {
    if (0 < (int)uVar2) {
      uVar9 = 0;
      do {
        pmVar7 = m2->rows[uVar9].right;
        for (pmVar8 = m1->rows[uVar9].right; -1 < pmVar8->row; pmVar8 = pmVar8->right) {
          if (pmVar7->row < 0) {
            return 0;
          }
          if (pmVar8->col != pmVar7->col) {
            return 0;
          }
          pmVar7 = pmVar7->right;
        }
        if (-1 < pmVar7->row) {
          return 0;
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 != uVar2);
    }
    return 1;
  }
  mod2sparse_equal_cold_1();
  if ((m1->n_rows == m2->n_cols) && (m1->n_cols == m2->n_rows)) {
    if (m2 != m1) {
      mod2sparse_clear(m2);
      iVar4 = m1->n_rows;
      if (0 < iVar4) {
        lVar11 = 0;
        do {
          pmVar7 = m1->rows[lVar11].right;
          if (-1 < pmVar7->row) {
            do {
              mod2sparse_insert(m2,pmVar7->col,(int)lVar11);
              pmVar7 = pmVar7->right;
            } while (-1 < pmVar7->row);
            iVar4 = m1->n_rows;
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 < iVar4);
      }
      return iVar4;
    }
  }
  else {
    mod2sparse_transpose_cold_1();
  }
  mod2sparse_transpose_cold_2();
  if ((((m1->n_rows == r->n_rows) && (m1->n_cols == r->n_cols)) && (m2->n_rows == m1->n_rows)) &&
     (m2->n_cols == m1->n_cols)) {
    if ((r != m1) && (r != m2)) {
      mod2sparse_clear(r);
      if (r->n_rows < 1) {
        return extraout_EAX;
      }
      lVar11 = 0;
LAB_00121cf6:
      pmVar7 = m1->rows[lVar11].right;
      pmVar8 = m2->rows[lVar11].right;
      while (iVar4 = (int)lVar11, -1 < pmVar7->row) {
        if (pmVar8->row < 0) goto LAB_00121d4a;
        iVar5 = pmVar7->col;
        col = pmVar8->col;
        if (iVar5 == col) {
          pmVar7 = pmVar7->right;
LAB_00121d44:
          pmVar8 = pmVar8->right;
        }
        else {
          if (col <= iVar5) {
            mod2sparse_insert(r,iVar4,col);
            goto LAB_00121d44;
          }
          mod2sparse_insert(r,iVar4,iVar5);
          pmVar7 = pmVar7->right;
        }
      }
      goto LAB_00121d77;
    }
  }
  else {
    mod2sparse_add_cold_1();
  }
  mod2sparse_add_cold_2();
  if (((m1->n_cols == m2->n_rows) && (m1->n_rows == r_00->n_rows)) && (m2->n_cols == r_00->n_cols))
  {
    if ((r_00 != m1) && (r_00 != m2)) {
      mod2sparse_clear(r_00);
      iVar4 = m1->n_rows;
      iVar5 = extraout_EAX_00;
      if (0 < iVar4) {
        lVar11 = 0;
        do {
          if ((-1 < (m1->rows[lVar11].right)->row) && (iVar5 = m2->n_cols, 0 < iVar5)) {
            lVar10 = 0;
            do {
              pmVar7 = m1->rows[lVar11].right;
              if (-1 < pmVar7->row) {
                pmVar8 = m2->cols[lVar10].down;
                bVar3 = false;
                do {
                  iVar4 = pmVar8->row;
                  if (iVar4 < 0) break;
                  if (pmVar7->col == iVar4) {
                    bVar3 = (bool)(bVar3 ^ 1);
                    pmVar7 = pmVar7->right;
LAB_00121e59:
                    pmVar8 = pmVar8->down;
                  }
                  else {
                    if (iVar4 <= pmVar7->col) goto LAB_00121e59;
                    pmVar7 = pmVar7->right;
                  }
                } while (-1 < pmVar7->row);
                if (bVar3) {
                  mod2sparse_insert(r_00,(int)lVar11,(int)lVar10);
                  iVar5 = m2->n_cols;
                }
              }
              lVar10 = lVar10 + 1;
            } while (lVar10 < iVar5);
            iVar4 = m1->n_rows;
          }
          lVar11 = lVar11 + 1;
          iVar5 = iVar4;
        } while (lVar11 < iVar4);
      }
      return iVar5;
    }
  }
  else {
    mod2sparse_multiply_cold_1();
  }
  mod2sparse_multiply_cold_2();
  uVar2 = m1->n_cols;
  pvVar6 = extraout_RAX;
  if (0 < (long)m1->n_rows) {
    pvVar6 = memset(__s,0,(long)m1->n_rows);
  }
  if (0 < (int)uVar2) {
    pvVar6 = (void *)0x0;
    do {
      if (*(char *)((long)&m2->n_rows + (long)pvVar6) != '\0') {
        for (pmVar7 = m1->cols[(long)pvVar6].down; -1 < pmVar7->row; pmVar7 = pmVar7->down) {
          pbVar1 = (byte *)((long)__s + (ulong)(uint)pmVar7->row);
          *pbVar1 = *pbVar1 ^ 1;
        }
      }
      pvVar6 = (void *)((long)pvVar6 + 1);
    } while (pvVar6 != (void *)(ulong)uVar2);
  }
  return (int)pvVar6;
LAB_00121d4a:
  do {
    mod2sparse_insert(r,iVar4,pmVar7->col);
    pmVar7 = pmVar7->right;
  } while (-1 < pmVar7->row);
LAB_00121d77:
  for (; -1 < pmVar8->row; pmVar8 = pmVar8->right) {
    mod2sparse_insert(r,iVar4,pmVar8->col);
  }
  lVar11 = lVar11 + 1;
  if (r->n_rows <= lVar11) {
    return r->n_rows;
  }
  goto LAB_00121cf6;
}

Assistant:

int mod2sparse_equal
( mod2sparse *m1,
  mod2sparse *m2
)
{
  mod2entry *e1, *e2;
  int i;

  if (mod2sparse_rows(m1)!=mod2sparse_rows(m2) 
   || mod2sparse_cols(m1)!=mod2sparse_cols(m2))
  { fprintf(stderr,"mod2sparse_equal: Matrices have different dimensions\n");
    exit(1);
  }
  
  for (i = 0; i<mod2sparse_rows(m1); i++)
  { 
    e1 = mod2sparse_first_in_row(m1,i);
    e2 = mod2sparse_first_in_row(m2,i);

    while (!mod2sparse_at_end(e1) && !mod2sparse_at_end(e2))
    {  
      if (mod2sparse_col(e1)!=mod2sparse_col(e2))
      { return 0;
      }

      e1 = mod2sparse_next_in_row(e1);
      e2 = mod2sparse_next_in_row(e2);
    }

    if (!mod2sparse_at_end(e1) || !mod2sparse_at_end(e2)) 
    { return 0;
    }
  }

  return 1;
}